

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O1

bool setup::is_simple_expression(string *expression)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  
  bVar2 = true;
  if (expression->_M_string_length != 0) {
    pbVar3 = (byte *)(expression->_M_dataplus)._M_p;
    bVar1 = *pbVar3;
    if (((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) && (bVar1 != 0x5f)) && (bVar1 != 0x2d)) {
      return false;
    }
    bVar1 = *pbVar3;
    while (bVar1 != 0) {
      pbVar3 = pbVar3 + 1;
      bVar2 = true;
      if (0x19 < (byte)(bVar1 + 0x9f)) {
        bVar2 = (bVar1 == 0x2d || bVar1 == 0x5f) || (byte)(bVar1 + 0xbf) < 0x1a;
      }
      bVar2 = (bool)(bVar1 == 0x5c | bVar2 | (byte)(bVar1 - 0x30) < 10);
      if (!bVar2) {
        return bVar2;
      }
      bVar1 = *pbVar3;
    }
  }
  return bVar2;
}

Assistant:

bool is_simple_expression(const std::string & expression) {
	if(expression.empty()) {
		return true;
	}
	const char * c = expression.c_str();
	if(!is_identifier_start(*c)) {
		return false;
	}
	while(*c) {
		if(!is_identifier(*c)) {
			return false;
		}
		c++;
	}
	return true;
}